

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::AtomicCounterTests::AtomicCounterTests
          (AtomicCounterTests *this,Context *context)

{
  int iVar1;
  int iVar2;
  Context *pCVar3;
  TestCaseGroup *pTVar4;
  char *pcVar5;
  char *pcVar6;
  AtomicCounterTest *pAVar7;
  TestCaseGroup *pTVar8;
  undefined1 uVar9;
  TestSpec *spec_00;
  TestSpec *spec_01;
  undefined1 auVar10 [16];
  undefined1 local_34c [8];
  TestSpec spec_6;
  TestSpec spec_5;
  TestSpec spec_4;
  TestSpec spec_3;
  TestSpec spec_2;
  TestCaseGroup *invalidGroup;
  string local_2b0;
  string local_290;
  undefined1 local_270 [8];
  TestSpec spec_1;
  int threadCount_1;
  int threadCountNdx_1;
  int callCount_1;
  int callCountNdx_1;
  int counterCount_1;
  int counterCountNdx_1;
  string local_218;
  TestCaseGroup *local_1f8;
  TestCaseGroup *operationGroup_1;
  Operation operation_1;
  int operationNdx_1;
  string local_1e0;
  undefined4 local_1bc;
  string local_1b8;
  TestCaseGroup *local_198;
  TestCaseGroup *layoutQualifierGroup;
  OffsetType offsetType;
  int offsetTypeNdx;
  OffsetType offsetTypes [4];
  Operation operations_1 [3];
  int threadCounts_1 [2];
  int callCounts_1 [2];
  int counterCounts_1 [2];
  TestCaseGroup *layoutGroup;
  string local_138;
  string local_118;
  undefined1 local_f8 [8];
  TestSpec spec;
  int threadCount;
  int threadCountNdx;
  int callCount;
  int callCountNdx;
  int counterCount;
  int counterCountNdx;
  string local_a0;
  TestCaseGroup *local_70;
  TestCaseGroup *operationGroup;
  Operation OStack_60;
  bool useBranch;
  int branch;
  Operation operation;
  int operationNdx;
  Operation operations [7];
  int threadCounts [3];
  int callCounts [3];
  int counterCounts [3];
  Context *context_local;
  AtomicCounterTests *this_local;
  
  TestCaseGroup::TestCaseGroup
            (&this->super_TestCaseGroup,context,"atomic_counter","Atomic counter tests");
  pcVar6 = (char *)0x0;
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__AtomicCounterTests_032af200;
  callCounts[1] = 1;
  callCounts[2] = 4;
  threadCounts[1] = 1;
  threadCounts[2] = 5;
  callCounts[0] = 100;
  operations[5] = OPERATION_INC;
  operations[6] = 10;
  threadCounts[0] = 5000;
  _operation = 0x100000004;
  operations[0] = OPERATION_DEC;
  operations[1] = OPERATION_GET|OPERATION_INC;
  operations[2] = OPERATION_GET|OPERATION_DEC;
  operations[3] = OPERATION_DEC|OPERATION_INC;
  operations[4] = OPERATION_GET|OPERATION_DEC|OPERATION_INC;
  for (branch = 0; branch < 7; branch = branch + 1) {
    OStack_60 = (&operation)[branch];
    for (operationGroup._4_4_ = 0; uVar9 = SUB81(pcVar6,0), operationGroup._4_4_ < 2;
        operationGroup._4_4_ = operationGroup._4_4_ + 1) {
      operationGroup._3_1_ = operationGroup._4_4_ == 1;
      pTVar4 = (TestCaseGroup *)operator_new(0x78);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      Functional::(anonymous_namespace)::operationToName_abi_cxx11_
                (&local_a0,(_anonymous_namespace_ *)&stack0xffffffffffffffa0,
                 (Operation *)(ulong)((byte)operationGroup._3_1_ & 1),(bool)uVar9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Functional::(anonymous_namespace)::operationToDescription_abi_cxx11_
                ((string *)&counterCountNdx,(_anonymous_namespace_ *)&stack0xffffffffffffffa0,
                 (Operation *)(ulong)((byte)operationGroup._3_1_ & 1),(bool)uVar9);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      TestCaseGroup::TestCaseGroup(pTVar4,pCVar3,pcVar5,pcVar6);
      std::__cxx11::string::~string((string *)&counterCountNdx);
      std::__cxx11::string::~string((string *)&local_a0);
      local_70 = pTVar4;
      for (callCountNdx = 0; callCountNdx < 3; callCountNdx = callCountNdx + 1) {
        iVar1 = callCounts[(long)callCountNdx + 1];
        for (threadCountNdx = 0; threadCountNdx < 3; threadCountNdx = threadCountNdx + 1) {
          iVar2 = threadCounts[(long)threadCountNdx + 1];
          for (spec.bindingType = BINDINGTYPE_BASIC; (int)spec.bindingType < 3;
              spec.bindingType = spec.bindingType + BINDINGTYPE_INVALID) {
            spec.offsetType = operations[(long)(int)spec.bindingType + 5];
            if (((int)(spec.offsetType * iVar2 * iVar1) < 0x2711) &&
               (((operationGroup._3_1_ & OPERATION_INC) == 0 || (spec.offsetType * iVar2 != 1)))) {
              Functional::anon_unknown_0::AtomicCounterTest::TestSpec::TestSpec
                        ((TestSpec *)local_f8);
              pTVar4 = local_70;
              local_f8._4_4_ = OStack_60;
              spec.operations._0_1_ = operationGroup._3_1_ & OPERATION_INC;
              spec.callCount = spec.offsetType;
              spec.threadCount = 0;
              spec.useBranches = false;
              spec._13_3_ = 0;
              local_f8._0_4_ = iVar1;
              spec.atomicCounterCount = iVar2;
              pAVar7 = (AtomicCounterTest *)operator_new(0x98);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              Functional::(anonymous_namespace)::specToTestName_abi_cxx11_
                        (&local_118,(_anonymous_namespace_ *)local_f8,spec_00);
              auVar10 = std::__cxx11::string::c_str();
              Functional::(anonymous_namespace)::specToTestDescription_abi_cxx11_
                        (&local_138,(_anonymous_namespace_ *)local_f8,auVar10._8_8_);
              pcVar6 = (char *)std::__cxx11::string::c_str();
              Functional::anon_unknown_0::AtomicCounterTest::AtomicCounterTest
                        (pAVar7,pCVar3,auVar10._0_8_,pcVar6,(TestSpec *)local_f8);
              tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pAVar7);
              std::__cxx11::string::~string((string *)&local_138);
              std::__cxx11::string::~string((string *)&local_118);
            }
          }
        }
      }
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)local_70);
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  pcVar6 = "Layout qualifier tests.";
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"layout","Layout qualifier tests.");
  callCounts_1[0] = 1;
  callCounts_1[1] = 8;
  threadCounts_1[0] = 1;
  threadCounts_1[1] = 5;
  operations_1[1] = OPERATION_INC;
  operations_1[2] = 1000;
  operations_1[0] = OPERATION_DEC|OPERATION_INC;
  _offsetType = 0x300000002;
  offsetTypes[0] = OFFSETTYPE_DEFAULT_AUTO;
  offsetTypes[1] = OFFSETTYPE_RESET_DEFAULT;
  for (layoutQualifierGroup._4_4_ = 0; layoutQualifierGroup._4_4_ < 4;
      layoutQualifierGroup._4_4_ = layoutQualifierGroup._4_4_ + 1) {
    layoutQualifierGroup._0_4_ = (&offsetType)[layoutQualifierGroup._4_4_];
    pTVar8 = (TestCaseGroup *)operator_new(0x78);
    operation_1._3_1_ = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    local_1bc = 0;
    Functional::(anonymous_namespace)::layoutTypesToName_abi_cxx11_
              (&local_1b8,(_anonymous_namespace_ *)&local_1bc,(BindingType *)&layoutQualifierGroup,
               (OffsetType *)pcVar6);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    operationNdx_1 = 0;
    Functional::(anonymous_namespace)::layoutTypesToDesc_abi_cxx11_
              (&local_1e0,(_anonymous_namespace_ *)&operationNdx_1,
               (BindingType *)&layoutQualifierGroup,(OffsetType *)pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    TestCaseGroup::TestCaseGroup(pTVar8,pCVar3,pcVar5,pcVar6);
    operation_1._3_1_ = 0;
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1b8);
    local_198 = pTVar8;
    for (operationGroup_1._4_4_ = 0; operationGroup_1._4_4_ < 3;
        operationGroup_1._4_4_ = operationGroup_1._4_4_ + 1) {
      operationGroup_1._0_4_ = operations_1[(long)operationGroup_1._4_4_ + -2];
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      uVar9 = SUB81(pcVar6,0);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      Functional::(anonymous_namespace)::operationToName_abi_cxx11_
                (&local_218,(_anonymous_namespace_ *)&operationGroup_1,(Operation *)0x0,(bool)uVar9)
      ;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Functional::(anonymous_namespace)::operationToDescription_abi_cxx11_
                ((string *)&counterCountNdx_1,(_anonymous_namespace_ *)&operationGroup_1,
                 (Operation *)0x0,(bool)uVar9);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      TestCaseGroup::TestCaseGroup(pTVar8,pCVar3,pcVar5,pcVar6);
      std::__cxx11::string::~string((string *)&counterCountNdx_1);
      std::__cxx11::string::~string((string *)&local_218);
      local_1f8 = pTVar8;
      for (callCountNdx_1 = 0; callCountNdx_1 < 2; callCountNdx_1 = callCountNdx_1 + 1) {
        iVar1 = callCounts_1[callCountNdx_1];
        if ((((((OffsetType)layoutQualifierGroup != OFFSETTYPE_FIRST_AUTO) || (2 < iVar1)) &&
             (((OffsetType)layoutQualifierGroup != OFFSETTYPE_DEFAULT_AUTO || (1 < iVar1)))) &&
            (((OffsetType)layoutQualifierGroup != OFFSETTYPE_RESET_DEFAULT || (1 < iVar1)))) &&
           (((OffsetType)layoutQualifierGroup != OFFSETTYPE_REVERSE || (1 < iVar1)))) {
          for (threadCountNdx_1 = 0; threadCountNdx_1 < 2; threadCountNdx_1 = threadCountNdx_1 + 1)
          {
            iVar2 = threadCounts_1[threadCountNdx_1];
            for (spec_1.bindingType = BINDINGTYPE_BASIC; (int)spec_1.bindingType < 2;
                spec_1.bindingType = spec_1.bindingType + BINDINGTYPE_INVALID) {
              spec_1.offsetType = operations_1[(long)(int)spec_1.bindingType + 1];
              Functional::anon_unknown_0::AtomicCounterTest::TestSpec::TestSpec
                        ((TestSpec *)local_270);
              pTVar8 = local_1f8;
              local_270._4_4_ = (Operation)operationGroup_1;
              spec_1.operations._0_1_ = 0;
              spec_1.callCount = spec_1.offsetType;
              spec_1.threadCount = 0;
              spec_1._12_4_ = (OffsetType)layoutQualifierGroup;
              local_270._0_4_ = iVar1;
              spec_1.atomicCounterCount = iVar2;
              pAVar7 = (AtomicCounterTest *)operator_new(0x98);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              Functional::(anonymous_namespace)::specToTestName_abi_cxx11_
                        (&local_290,(_anonymous_namespace_ *)local_270,spec_01);
              auVar10 = std::__cxx11::string::c_str();
              Functional::(anonymous_namespace)::specToTestDescription_abi_cxx11_
                        (&local_2b0,(_anonymous_namespace_ *)local_270,auVar10._8_8_);
              pcVar6 = (char *)std::__cxx11::string::c_str();
              Functional::anon_unknown_0::AtomicCounterTest::AtomicCounterTest
                        (pAVar7,pCVar3,auVar10._0_8_,pcVar6,(TestSpec *)local_270);
              tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)pAVar7);
              std::__cxx11::string::~string((string *)&local_2b0);
              std::__cxx11::string::~string((string *)&local_290);
            }
          }
        }
      }
      tcu::TestNode::addChild((TestNode *)local_198,(TestNode *)local_1f8);
    }
    tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)local_198);
  }
  pTVar8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar8,(this->super_TestCaseGroup).m_context,"invalid","Test invalid layouts");
  Functional::anon_unknown_0::AtomicCounterTest::TestSpec::TestSpec((TestSpec *)&spec_3.offsetType);
  spec_3.offsetType = OFFSETTYPE_BASIC;
  spec_3.bindingType = BINDINGTYPE_INVALID;
  pAVar7 = (AtomicCounterTest *)operator_new(0x98);
  Functional::anon_unknown_0::AtomicCounterTest::AtomicCounterTest
            (pAVar7,(this->super_TestCaseGroup).m_context,"invalid_binding",
             "Test layout qualifiers with invalid binding.",(TestSpec *)&spec_3.offsetType);
  tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)pAVar7);
  Functional::anon_unknown_0::AtomicCounterTest::TestSpec::TestSpec((TestSpec *)&spec_4.offsetType);
  spec_4.offsetType = OFFSETTYPE_BASIC;
  spec_4.bindingType = BINDINGTYPE_INVALID;
  spec_3.atomicCounterCount = 1;
  spec_3.operations._0_1_ = 0;
  spec_3.callCount = 1;
  spec_3.threadCount = 2;
  spec_3.useBranches = false;
  spec_3._13_3_ = 0;
  pAVar7 = (AtomicCounterTest *)operator_new(0x98);
  Functional::anon_unknown_0::AtomicCounterTest::AtomicCounterTest
            (pAVar7,(this->super_TestCaseGroup).m_context,"invalid_default_binding",
             "Test layout qualifiers with invalid default binding.",(TestSpec *)&spec_4.offsetType);
  tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)pAVar7);
  Functional::anon_unknown_0::AtomicCounterTest::TestSpec::TestSpec((TestSpec *)&spec_5.offsetType);
  spec_5.offsetType = OFFSETTYPE_BASIC;
  spec_5.bindingType = BINDINGTYPE_INVALID;
  spec_4.atomicCounterCount = 1;
  spec_4.operations._0_1_ = 0;
  spec_4.callCount = 1;
  spec_4.threadCount = 0;
  spec_4.useBranches = true;
  spec_4._13_3_ = 0;
  pAVar7 = (AtomicCounterTest *)operator_new(0x98);
  Functional::anon_unknown_0::AtomicCounterTest::AtomicCounterTest
            (pAVar7,(this->super_TestCaseGroup).m_context,"invalid_offset_align",
             "Test layout qualifiers with invalid alignment offset.",(TestSpec *)&spec_5.offsetType)
  ;
  tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)pAVar7);
  Functional::anon_unknown_0::AtomicCounterTest::TestSpec::TestSpec((TestSpec *)&spec_6.offsetType);
  spec_6.offsetType = OFFSETTYPE_REVERSE;
  spec_6.bindingType = BINDINGTYPE_INVALID;
  spec_5.atomicCounterCount = 1;
  spec_5.operations._0_1_ = 0;
  spec_5.callCount = 1;
  spec_5.threadCount = 0;
  spec_5.useBranches = true;
  spec_5._13_3_ = 0;
  pAVar7 = (AtomicCounterTest *)operator_new(0x98);
  Functional::anon_unknown_0::AtomicCounterTest::AtomicCounterTest
            (pAVar7,(this->super_TestCaseGroup).m_context,"invalid_offset_overlap",
             "Test layout qualifiers with invalid overlapping offset.",
             (TestSpec *)&spec_6.offsetType);
  tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)pAVar7);
  Functional::anon_unknown_0::AtomicCounterTest::TestSpec::TestSpec((TestSpec *)local_34c);
  local_34c._0_4_ = 1;
  local_34c._4_4_ = OPERATION_INC;
  spec_6.atomicCounterCount = 1;
  spec_6.operations._0_1_ = 0;
  spec_6.callCount = 1;
  spec_6.threadCount = 0;
  spec_6.useBranches = true;
  spec_6._13_3_ = 0;
  pAVar7 = (AtomicCounterTest *)operator_new(0x98);
  Functional::anon_unknown_0::AtomicCounterTest::AtomicCounterTest
            (pAVar7,(this->super_TestCaseGroup).m_context,"invalid_default_offset",
             "Test layout qualifiers with invalid default offset.",(TestSpec *)local_34c);
  tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)pAVar7);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar8);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  return;
}

Assistant:

AtomicCounterTests::AtomicCounterTests (Context& context)
	: TestCaseGroup(context, "atomic_counter", "Atomic counter tests")
{
	// Runtime use tests
	{
		const int counterCounts[] =
		{
			1, 4, 8
		};

		const int callCounts[] =
		{
			1, 5, 100
		};

		const int threadCounts[] =
		{
			1, 10, 5000
		};

		const AtomicCounterTest::Operation operations[] =
		{
			AtomicCounterTest::OPERATION_GET,
			AtomicCounterTest::OPERATION_INC,
			AtomicCounterTest::OPERATION_DEC,

			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_GET),
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_DEC|AtomicCounterTest::OPERATION_GET),

			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_DEC),
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_DEC|AtomicCounterTest::OPERATION_GET)
		};

		for (int operationNdx = 0; operationNdx < DE_LENGTH_OF_ARRAY(operations); operationNdx++)
		{
			const AtomicCounterTest::Operation operation = operations[operationNdx];

			for (int branch = 0; branch < 2; branch++)
			{
				const bool useBranch = (branch == 1);

				TestCaseGroup* operationGroup = new TestCaseGroup(m_context, operationToName(operation, useBranch).c_str(), operationToDescription(operation, useBranch).c_str());

				for (int counterCountNdx = 0; counterCountNdx < DE_LENGTH_OF_ARRAY(counterCounts); counterCountNdx++)
				{
					const int counterCount = counterCounts[counterCountNdx];

					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); callCountNdx++)
					{
						const int callCount = callCounts[callCountNdx];

						for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
						{
							const int threadCount = threadCounts[threadCountNdx];

							if (threadCount * callCount * counterCount > 10000)
								continue;

							if (useBranch && threadCount * callCount == 1)
								continue;

							AtomicCounterTest::TestSpec spec;

							spec.atomicCounterCount = counterCount;
							spec.operations			= operation;
							spec.callCount			= callCount;
							spec.useBranches		= useBranch;
							spec.threadCount		= threadCount;
							spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
							spec.offsetType			= AtomicCounterTest::OFFSETTYPE_NONE;

							operationGroup->addChild(new AtomicCounterTest(m_context, specToTestName(spec).c_str(), specToTestDescription(spec).c_str(), spec));
						}
					}
				}

				addChild(operationGroup);
			}
		}
	}

	{
		TestCaseGroup* layoutGroup = new TestCaseGroup(m_context, "layout", "Layout qualifier tests.");

		const int counterCounts[]	= { 1, 8 };
		const int callCounts[]		= { 1, 5 };
		const int threadCounts[]	= { 1, 1000 };

		const AtomicCounterTest::Operation operations[] =
		{
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_GET),
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_DEC|AtomicCounterTest::OPERATION_GET),
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_DEC)
		};

		const AtomicCounterTest::OffsetType offsetTypes[] =
		{
			AtomicCounterTest::OFFSETTYPE_REVERSE,
			AtomicCounterTest::OFFSETTYPE_FIRST_AUTO,
			AtomicCounterTest::OFFSETTYPE_DEFAULT_AUTO,
			AtomicCounterTest::OFFSETTYPE_RESET_DEFAULT
		};

		for (int offsetTypeNdx = 0; offsetTypeNdx < DE_LENGTH_OF_ARRAY(offsetTypes); offsetTypeNdx++)
		{
			const AtomicCounterTest::OffsetType offsetType = offsetTypes[offsetTypeNdx];

			TestCaseGroup* layoutQualifierGroup = new TestCaseGroup(m_context, layoutTypesToName(AtomicCounterTest::BINDINGTYPE_BASIC, offsetType).c_str(), layoutTypesToDesc(AtomicCounterTest::BINDINGTYPE_BASIC, offsetType).c_str());

			for (int operationNdx = 0; operationNdx < DE_LENGTH_OF_ARRAY(operations); operationNdx++)
			{
				const AtomicCounterTest::Operation operation = operations[operationNdx];

				TestCaseGroup* operationGroup = new TestCaseGroup(m_context, operationToName(operation, false).c_str(), operationToDescription(operation, false).c_str());

				for (int counterCountNdx = 0; counterCountNdx < DE_LENGTH_OF_ARRAY(counterCounts); counterCountNdx++)
				{
					const int counterCount = counterCounts[counterCountNdx];

					if (offsetType == AtomicCounterTest::OFFSETTYPE_FIRST_AUTO && counterCount < 3)
						continue;

					if (offsetType == AtomicCounterTest::OFFSETTYPE_DEFAULT_AUTO && counterCount < 2)
						continue;

					if (offsetType == AtomicCounterTest::OFFSETTYPE_RESET_DEFAULT && counterCount < 2)
						continue;

					if (offsetType == AtomicCounterTest::OFFSETTYPE_REVERSE && counterCount < 2)
						continue;

					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); callCountNdx++)
					{
						const int callCount = callCounts[callCountNdx];

						for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
						{
							const int threadCount = threadCounts[threadCountNdx];

							AtomicCounterTest::TestSpec spec;

							spec.atomicCounterCount = counterCount;
							spec.operations			= operation;
							spec.callCount			= callCount;
							spec.useBranches		= false;
							spec.threadCount		= threadCount;
							spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
							spec.offsetType			= offsetType;

							operationGroup->addChild(new AtomicCounterTest(m_context, specToTestName(spec).c_str(), specToTestDescription(spec).c_str(), spec));
						}
					}
				}
				layoutQualifierGroup->addChild(operationGroup);
			}
			layoutGroup->addChild(layoutQualifierGroup);
		}

		{
			TestCaseGroup* invalidGroup = new TestCaseGroup(m_context, "invalid", "Test invalid layouts");

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 1;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_INVALID;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_NONE;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_binding", "Test layout qualifiers with invalid binding.", spec));
			}

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 1;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_INVALID_DEFAULT;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_NONE;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_default_binding", "Test layout qualifiers with invalid default binding.", spec));
			}

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 1;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_INVALID;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_offset_align", "Test layout qualifiers with invalid alignment offset.", spec));
			}

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 2;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_INVALID_OVERLAPPING;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_offset_overlap", "Test layout qualifiers with invalid overlapping offset.", spec));
			}

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 1;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_INVALID_DEFAULT;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_default_offset", "Test layout qualifiers with invalid default offset.", spec));
			}

			layoutGroup->addChild(invalidGroup);
		}

		addChild(layoutGroup);
	}
}